

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O2

ConversionResult
llvm::ConvertUTF16toUTF8
          (UTF16 **sourceStart,UTF16 *sourceEnd,UTF8 **targetStart,UTF8 *targetEnd,
          ConversionFlags flags)

{
  ushort uVar1;
  ushort *puVar2;
  UTF8 *pUVar3;
  ConversionResult CVar4;
  ushort uVar5;
  uint uVar6;
  
  puVar2 = *sourceStart;
  pUVar3 = *targetStart;
  CVar4 = sourceIllegal;
  if (puVar2 < sourceEnd) {
    uVar5 = *puVar2;
    uVar6 = (uint)uVar5;
    if ((uVar5 & 0xfc00) == 0xd800) {
      if (sourceEnd <= puVar2 + 1) {
        CVar4 = sourceExhausted;
        goto LAB_0016cde3;
      }
      uVar1 = puVar2[1];
      if ((uVar1 & 0xfc00) == 0xdc00) {
        uVar6 = (uint)uVar5 * 0x400 + (uint)uVar1 + 0xfca02400;
      }
      else if (flags == strictConversion) goto LAB_0016cde3;
    }
    else if ((flags == strictConversion) && ((uVar5 & 0xfc00) == 0xdc00)) goto LAB_0016cde3;
    uVar5 = 1;
    if ((0x7f < uVar6) && (uVar5 = 2, 0x7ff < uVar6)) {
      uVar5 = 4 - (uVar6 < 0x10000);
    }
    if (pUVar3 + uVar5 <= targetEnd) {
      CVar4 = (*(code *)((long)&DAT_00191880 + (long)(int)(&DAT_00191880)[uVar5 - 1]))();
      return CVar4;
    }
    CVar4 = targetExhausted;
  }
  else {
    CVar4 = conversionOK;
  }
LAB_0016cde3:
  *sourceStart = puVar2;
  *targetStart = pUVar3;
  return CVar4;
}

Assistant:

ConversionResult ConvertUTF16toUTF8 (
        const UTF16** sourceStart, const UTF16* sourceEnd,
        UTF8** targetStart, UTF8* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF16* source = *sourceStart;
    UTF8* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch;
        unsigned short bytesToWrite = 0;
        const UTF32 byteMask = 0xBF;
        const UTF32 byteMark = 0x80;
        const UTF16* oldSource = source; /* In case we have to back up because of target overflow. */
        ch = *source++;
        /* If we have a surrogate pair, convert to UTF32 first. */
        if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_HIGH_END) {
            /* If the 16 bits following the high surrogate are in the source buffer... */
            if (source < sourceEnd) {
                UTF32 ch2 = *source;
                /* If it's a low surrogate, convert to UTF32. */
                if (ch2 >= UNI_SUR_LOW_START && ch2 <= UNI_SUR_LOW_END) {
                    ch = ((ch - UNI_SUR_HIGH_START) << halfShift)
                        + (ch2 - UNI_SUR_LOW_START) + halfBase;
                    ++source;
                } else if (flags == strictConversion) { /* it's an unpaired high surrogate */
                    --source; /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                }
            } else { /* We don't have the 16 bits following the high surrogate. */
                --source; /* return to the high surrogate */
                result = sourceExhausted;
                break;
            }
        } else if (flags == strictConversion) {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_LOW_START && ch <= UNI_SUR_LOW_END) {
                --source; /* return to the illegal value itself */
                result = sourceIllegal;
                break;
            }
        }
        /* Figure out how many bytes the result will require */
        if (ch < (UTF32)0x80) {      bytesToWrite = 1;
        } else if (ch < (UTF32)0x800) {     bytesToWrite = 2;
        } else if (ch < (UTF32)0x10000) {   bytesToWrite = 3;
        } else if (ch < (UTF32)0x110000) {  bytesToWrite = 4;
        } else {                            bytesToWrite = 3;
                                            ch = UNI_REPLACEMENT_CHAR;
        }

        target += bytesToWrite;
        if (target > targetEnd) {
            source = oldSource; /* Back up source pointer! */
            target -= bytesToWrite; result = targetExhausted; break;
        }
        switch (bytesToWrite) { /* note: everything falls through. */
            case 4: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 3: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 2: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 1: *--target =  (UTF8)(ch | firstByteMark[bytesToWrite]);
        }
        target += bytesToWrite;
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}